

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HLSL2GLSLConverterImpl.cpp
# Opt level: O1

void __thiscall
Diligent::HLSL2GLSLConverterImpl::ConversionStream::RegisterStruct
          (ConversionStream *this,iterator *Token)

{
  TokenListType *pTVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  int iVar4;
  _List_iterator<Diligent::Parsing::HLSLTokenInfo> _Var5;
  char (*in_RCX) [66];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string msg;
  string local_68;
  String local_48;
  
  if (*(int *)&Token->_M_node[1]._M_next == 0x115) {
    iVar4 = std::__cxx11::string::compare((char *)&Token->_M_node[1]._M_prev);
    if (iVar4 == 0) goto LAB_0037b8da;
  }
  FormatString<char[26],char[66]>
            (&local_68,(Diligent *)"Debug expression failed:\n",
             (char (*) [26])"Token->Type == TokenType::kw_struct && Token->Literal == \"struct\"",
             in_RCX);
  DebugAssertionFailed
            (local_68._M_dataplus._M_p,"RegisterStruct",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
             ,0x473);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_0037b8da:
  p_Var2 = Token->_M_node->_M_next;
  Token->_M_node = p_Var2;
  pTVar1 = &this->m_Tokens;
  if ((p_Var2 == (_List_node_base *)pTVar1) || (*(int *)&p_Var2[1]._M_next != 0x13b)) {
    FormatString<char[20]>(&local_68,(char (*) [20])"Identifier expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_48,this,Token,4)
    ;
    in_R8 = &local_68;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"RegisterStruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x478,in_R8,(char (*) [2])0x83f885,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var2 = Token->_M_node;
  local_68._M_dataplus._M_p = (pointer)p_Var2[1]._M_prev;
  local_68._M_string_length = (size_type)p_Var2;
  std::
  _Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<char_const*,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>>
            ((_Hashtable<Diligent::HashMapStringKey,std::pair<Diligent::HashMapStringKey_const,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>,std::allocator<std::pair<Diligent::HashMapStringKey_const,std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>>,std::__detail::_Select1st,std::equal_to<Diligent::HashMapStringKey>,std::hash<Diligent::HashMapStringKey>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->m_StructDefinitions);
  p_Var3 = Token->_M_node->_M_next;
  Token->_M_node = p_Var3;
  if ((p_Var3 == (_List_node_base *)pTVar1) || (*(int *)&p_Var3[1]._M_next != 0x133)) {
    FormatString<char[20]>(&local_68,(char (*) [20])"Open brace expected");
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_48,this,Token,4)
    ;
    in_R8 = &local_68;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"RegisterStruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x480,in_R8,(char (*) [2])0x83f885,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  local_68._M_dataplus._M_p =
       (pointer)(pTVar1->
                super__List_base<Diligent::Parsing::HLSLTokenInfo,_std::allocator<Diligent::Parsing::HLSLTokenInfo>_>
                )._M_impl._M_node.super__List_node_base._M_next;
  local_48._M_dataplus._M_p = (pointer)pTVar1;
  _Var5 = Parsing::FindMatchingBracket<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>
                    ((_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_68,
                     (_List_iterator<Diligent::Parsing::HLSLTokenInfo> *)&local_48,Token->_M_node);
  Token->_M_node = _Var5._M_node;
  if (_Var5._M_node == (_List_node_base *)pTVar1) {
    FormatString<char[38],std::__cxx11::string,char[2]>
              (&local_68,(Diligent *)"Missing closing brace for structure \"",
               (char (*) [38])&p_Var2[1]._M_prev,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x85d44f,
               (char (*) [2])in_R8);
    PrintTokenContext<std::_List_iterator<Diligent::Parsing::HLSLTokenInfo>>(&local_48,this,Token,4)
    ;
    LogError<true,std::__cxx11::string,char[2],std::__cxx11::string>
              (false,"RegisterStruct",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/HLSL2GLSLConverterLib/src/HLSL2GLSLConverterImpl.cpp"
               ,0x484,&local_68,(char (*) [2])0x83f885,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  Token->_M_node = Token->_M_node->_M_next;
  return;
}

Assistant:

void HLSL2GLSLConverterImpl::ConversionStream::RegisterStruct(TokenListType::iterator& Token)
{
    // struct VSOutput
    // ^
    VERIFY_EXPR(Token->Type == TokenType::kw_struct && Token->Literal == "struct");

    ++Token;
    // struct VSOutput
    //        ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::Identifier, "Identifier expected");
    auto& StructName = Token->Literal;
    m_StructDefinitions.insert(std::make_pair(StructName.c_str(), Token));

    ++Token;
    // struct VSOutput
    // {
    // ^
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end() && Token->Type == TokenType::OpenBrace, "Open brace expected");

    // Find closing brace
    Token = Parsing::FindMatchingBracket(m_Tokens.begin(), m_Tokens.end(), Token);
    VERIFY_PARSER_STATE(Token, Token != m_Tokens.end(), "Missing closing brace for structure \"", StructName, "\"");
    // }
    // ^
    ++Token;
}